

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeSetCacheSize(Btree *p,int mxPage)

{
  int *piVar1;
  BtShared *pBVar2;
  PCache *pPVar3;
  int iVar4;
  int extraout_EAX;
  ulong uVar5;
  ulong uVar6;
  
  pBVar2 = p->pBt;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  pPVar3 = pBVar2->pPager->pPCache;
  pPVar3->szCache = mxPage;
  uVar6 = (ulong)(uint)mxPage;
  if (mxPage < 0) {
    uVar5 = ((long)mxPage * -0x400) / ((long)pPVar3->szExtra + (long)pPVar3->szPage);
    uVar6 = 1000000000;
    if ((long)uVar5 < 1000000000) {
      uVar6 = uVar5;
    }
  }
  iVar4 = (*sqlite3Config.pcache2.xCachesize)(pPVar3->pCache,(int)uVar6);
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
      return extraout_EAX;
    }
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetCacheSize(Btree *p, int mxPage){
  BtShared *pBt = p->pBt;
  assert( sqlite3_mutex_held(p->db->mutex) );
  sqlite3BtreeEnter(p);
  sqlite3PagerSetCachesize(pBt->pPager, mxPage);
  sqlite3BtreeLeave(p);
  return SQLITE_OK;
}